

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

string * __thiscall
(anonymous_namespace)::TfFinder::getDA_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  char *__nptr;
  undefined1 trim_trailing_zeroes;
  void *pvVar4;
  string local_88;
  double local_68;
  double delta;
  string local_50 [8];
  string cur;
  size_t i;
  size_t n;
  TfFinder *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)this + 0x70));
  for (cur.field_2._8_8_ = 0; (ulong)cur.field_2._8_8_ < sVar2;
      cur.field_2._8_8_ = cur.field_2._8_8_ + 1) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)this + 0x70),cur.field_2._8_8_);
    std::__cxx11::string::string(local_50,(string *)pvVar3);
    iVar1 = QIntC::to_int<unsigned_long>((unsigned_long *)(cur.field_2._M_local_buf + 8));
    if (iVar1 == *(int *)((long)this + 0x18)) {
      pvVar4 = this;
      __nptr = (char *)std::__cxx11::string::c_str();
      trim_trailing_zeroes = SUB81(pvVar4,0);
      local_68 = strtod(__nptr,(char **)0x0);
      local_68 = local_68 - *(double *)((long)this + 0x10);
      if ((0.001 < local_68) || (local_68 < -0.001)) {
        QTC::TC("qpdf","QPDFFormFieldObjectHelper fallback Tf",0);
        QUtil::double_to_string_abi_cxx11_
                  (&local_88,(QUtil *)0x0,*(double *)((long)this + 0x10),1,
                   (bool)trim_trailing_zeroes);
        std::__cxx11::string::operator=(local_50,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_50);
    std::__cxx11::string::~string(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
TfFinder::getDA()
{
    std::string result;
    size_t n = this->DA.size();
    for (size_t i = 0; i < n; ++i) {
        std::string cur = this->DA.at(i);
        if (QIntC::to_int(i) == tf_idx) {
            double delta = strtod(cur.c_str(), nullptr) - this->tf;
            if ((delta > 0.001) || (delta < -0.001)) {
                // tf doesn't match the font size passed to Tf, so substitute.
                QTC::TC("qpdf", "QPDFFormFieldObjectHelper fallback Tf");
                cur = QUtil::double_to_string(tf);
            }
        }
        result += cur;
    }
    return result;
}